

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectives.hpp
# Opt level: O2

void diy::mpi::Collectives<char,_void_*>::gather
               (communicator *comm,vector<char,_std::allocator<char>_> *in,int root)

{
  pointer pcVar1;
  pointer pcVar2;
  int countIn;
  int local_2c;
  datatype local_28;
  
  pcVar1 = (in->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar2 = (in->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  local_2c = (int)pcVar2 - (int)pcVar1;
  if (pcVar1 == pcVar2) {
    local_2c = 0;
  }
  Collectives<int,_void_*>::gather(comm,&local_2c,root);
  pcVar1 = (in->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar2 = (in->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  countIn = (int)pcVar2 - (int)pcVar1;
  if (pcVar1 == pcVar2) {
    countIn = 0;
  }
  local_28.handle.data = (DIY_MPI_Datatype)&ompi_mpi_byte;
  detail::gather_v(comm,pcVar1,countIn,&local_28,(void *)0x0,(int *)0x0,(int *)0x0,root);
  return;
}

Assistant:

static void gather(const communicator& comm, const std::vector<T>& in, int root)
    {
      Collectives<int,void*>::gather(comm, count(in), root);
      detail::gather_v(comm, address(in), count(in), datatype_of(in), 0, 0, 0, root);
    }